

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_cmov(secp256k1_fe *r,secp256k1_fe *a,int flag)

{
  uint in_EDX;
  secp256k1_fe *in_RSI;
  secp256k1_fe *in_RDI;
  bool local_15;
  
  local_15 = 1 < in_EDX;
  if (local_15) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/field_impl.h"
            ,0x16d,"test condition failed: flag == 0 || flag == 1");
    abort();
  }
  secp256k1_fe_verify(in_RSI);
  secp256k1_fe_verify(in_RSI);
  secp256k1_fe_impl_cmov(in_RDI,in_RSI,in_EDX);
  if (in_RDI->magnitude < in_RSI->magnitude) {
    in_RDI->magnitude = in_RSI->magnitude;
  }
  if (in_RSI->normalized == 0) {
    in_RDI->normalized = 0;
  }
  secp256k1_fe_verify(in_RSI);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_cmov(secp256k1_fe *r, const secp256k1_fe *a, int flag) {
    VERIFY_CHECK(flag == 0 || flag == 1);
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_cmov(r, a, flag);
    if (a->magnitude > r->magnitude) r->magnitude = a->magnitude;
    if (!a->normalized) r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}